

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O1

int arkAdaptImExGus(ARKodeHAdaptMem hadapt_mem,int k,long nst,realtype hcur,realtype ecur,
                   realtype *hnew)

{
  realtype rVar1;
  realtype rVar2;
  realtype rVar3;
  realtype exponent;
  double dVar4;
  double dVar5;
  realtype base;
  double exponent_00;
  double local_58;
  
  if (nst < 2) {
    exponent = -1.0 / (double)k;
    local_58 = hcur;
    if (ecur <= 1e-10) {
      ecur = 1e-10;
    }
  }
  else {
    dVar4 = (double)k;
    exponent_00 = -hadapt_mem->k1 / dVar4;
    exponent = -hadapt_mem->k2 / dVar4;
    dVar4 = -hadapt_mem->k3 / dVar4;
    base = ecur;
    if (ecur <= 1e-10) {
      base = 1e-10;
    }
    dVar5 = hadapt_mem->ehist[0];
    if (dVar5 <= 1e-10) {
      dVar5 = 1e-10;
    }
    ecur = base / dVar5;
    dVar5 = hadapt_mem->hhist[0];
    rVar1 = SUNRpowerR(base,dVar4);
    rVar3 = SUNRpowerR(ecur,dVar4);
    rVar3 = rVar3 * rVar1 * (hcur / dVar5) * hcur;
    rVar1 = SUNRpowerR(base,exponent_00);
    rVar2 = SUNRpowerR(ecur,exponent);
    if (rVar3 < rVar2 * rVar1 * hcur) goto LAB_00425691;
    local_58 = SUNRpowerR(base,exponent_00);
    local_58 = local_58 * hcur;
  }
  rVar3 = SUNRpowerR(ecur,exponent);
  rVar3 = rVar3 * local_58;
LAB_00425691:
  *hnew = rVar3;
  return 0;
}

Assistant:

int arkAdaptImExGus(ARKodeHAdaptMem hadapt_mem, int k, long int nst,
                    realtype hcur, realtype ecur, realtype *hnew)
{
  realtype k1, k2, k3, e1, e2, hrat, h_acc;

  /* modified method for first step */
  if (nst < 2) {

    k1 = -ONE / k;
    e1 = SUNMAX(ecur, TINY);
    h_acc = hcur * SUNRpowerR(e1,k1);

  /* general estimate */
  } else {

    k1 = -hadapt_mem->k1 / k;
    k2 = -hadapt_mem->k2 / k;
    k3 = -hadapt_mem->k3 / k;
    e1 = SUNMAX(ecur, TINY);
    e2 = e1 / SUNMAX(hadapt_mem->ehist[0], TINY);
    hrat = hcur / hadapt_mem->hhist[0];
    /* implicit estimate */
    h_acc = hcur * hrat * SUNRpowerR(e1,k3) * SUNRpowerR(e2,k3);
    /* explicit estimate */
    h_acc = SUNMIN(h_acc, hcur * SUNRpowerR(e1,k1) * SUNRpowerR(e2,k2));

  }
  *hnew = h_acc;

  return(ARK_SUCCESS);
}